

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O2

ScriptContext * __thiscall JsrtContextCore::EnsureScriptContext(JsrtContextCore *this)

{
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  HeapAllocator *alloc;
  Type pCVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> newScriptContext;
  
  if ((this->super_JsrtContext).javascriptLibrary.ptr != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
                       ,0x49,"(this->GetJavascriptLibrary() == nullptr)",
                       "this->GetJavascriptLibrary() == nullptr");
    if (!bVar4) goto LAB_003a99f0;
    *puVar5 = 0;
  }
  threadContext = ((this->super_JsrtContext).runtime.ptr)->threadContext;
  data._32_8_ = Js::ScriptContext::New(threadContext);
  pSVar6 = BasePtr<Js::ScriptContext>::operator->((BasePtr<Js::ScriptContext> *)&data.line);
  Js::ScriptContext::Initialize(pSVar6);
  local_58 = (undefined1  [8])&ChakraCoreHostScriptContext::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6334a5;
  data.filename._0_4_ = 0x51;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  pCVar7 = (Type)new<Memory::HeapAllocator>(0x38,alloc,0x2f6726);
  (pCVar7->super_HostScriptContext).scriptContext = (ScriptContext *)data._32_8_;
  (pCVar7->super_HostScriptContext)._vptr_HostScriptContext = (_func_int **)&PTR_Delete_0136d8e0;
  pCVar7->fetchImportedModuleCallback = (FetchImportedModuleCallBack)0x0;
  pCVar7->fetchImportedModuleFromScriptCallback = (FetchImportedModuleFromScriptCallBack)0x0;
  pCVar7->notifyModuleReadyCallback = (NotifyModuleReadyCallback)0x0;
  pCVar7->initializeImportMetaCallback = (InitializeImportMetaCallback)0x0;
  pCVar7->reportModuleCompletionCallback = (ReportModuleCompletionCallback)0x0;
  this->hostContext = pCVar7;
  pSVar6 = BasePtr<Js::ScriptContext>::operator->((BasePtr<Js::ScriptContext> *)&data.line);
  Js::ScriptContext::SetHostScriptContext(pSVar6,&this->hostContext->super_HostScriptContext);
  uVar3 = data._32_8_;
  data.line = 0;
  data._36_4_ = 0;
  JsrtContext::SetJavascriptLibrary(&this->super_JsrtContext,*(JavascriptLibrary **)(uVar3 + 8));
  pJVar1 = (((((this->super_JsrtContext).javascriptLibrary.ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary;
  if (pJVar1 == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtContextCore.cpp"
                       ,0x57,"(library != nullptr)","library != nullptr");
    if (!bVar4) {
LAB_003a99f0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  Memory::Recycler::RootRelease
            (threadContext->recycler,(pJVar1->super_JavascriptLibraryBase).globalObject.ptr,
             (uint *)0x0);
  Js::JavascriptFunction::SetEntryPoint
            ((pJVar1->evalFunctionObject).ptr,Js::GlobalObject::EntryEval);
  Js::JavascriptFunction::SetEntryPoint
            (&((pJVar1->super_JavascriptLibraryBase).functionConstructor.ptr)->
              super_JavascriptFunction,Js::JavascriptFunction::NewInstance);
  pSVar6 = (((this->super_JsrtContext).javascriptLibrary.ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> *)&data.line);
  return pSVar6;
}

Assistant:

Js::ScriptContext* JsrtContextCore::EnsureScriptContext()
{
    Assert(this->GetJavascriptLibrary() == nullptr);

    ThreadContext* localThreadContext = this->GetRuntime()->GetThreadContext();

    AutoPtr<Js::ScriptContext> newScriptContext(Js::ScriptContext::New(localThreadContext));

    newScriptContext->Initialize();

    hostContext = HeapNew(ChakraCoreHostScriptContext, newScriptContext);
    newScriptContext->SetHostScriptContext(hostContext);

    this->SetJavascriptLibrary(newScriptContext.Detach()->GetLibrary());

    Js::JavascriptLibrary *library = this->GetScriptContext()->GetLibrary();
    Assert(library != nullptr);
    localThreadContext->GetRecycler()->RootRelease(library->GetGlobalObject());

    library->GetEvalFunctionObject()->SetEntryPoint(&Js::GlobalObject::EntryEval);
    library->GetFunctionConstructor()->SetEntryPoint(&Js::JavascriptFunction::NewInstance);

    return this->GetScriptContext();
}